

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::AutoCloseFd>_>::~ExceptionOr
          (ExceptionOr<kj::Maybe<kj::AutoCloseFd>_> *this)

{
  ExceptionOr<kj::Maybe<kj::AutoCloseFd>_> *this_local;
  
  Maybe<kj::Maybe<kj::AutoCloseFd>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;